

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O0

void __thiscall
libguarded::
rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
::rcu_guard::unlock(rcu_guard *this)

{
  node *__p;
  bool bVar1;
  __pointer_type pzVar2;
  __pointer_type prVar3;
  zombie_list_node *oldnode;
  node *deadNode;
  __pointer_type pzStack_20;
  bool last;
  zombie_list_node *n;
  zombie_list_node *cached_next;
  rcu_guard *this_local;
  
  pzVar2 = std::
           atomic<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::zombie_list_node_*>
           ::load(&this->m_zombie->next,seq_cst);
  bVar1 = true;
  pzStack_20 = pzVar2;
  do {
    if (pzStack_20 == (__pointer_type)0x0) {
LAB_0011dd2a:
      if (bVar1) {
        while (pzStack_20 = pzVar2, pzStack_20 != (zombie_list_node *)0x0) {
          __p = pzStack_20->zombie_node;
          if (__p != (node *)0x0) {
            std::
            allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>>
            ::
            destroy<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>
                      ((allocator_type *)(this->m_list + 0x40),__p);
            std::
            allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
            ::deallocate((allocator_type *)(this->m_list + 0x40),__p,1);
          }
          pzVar2 = std::
                   atomic<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::zombie_list_node_*>
                   ::load(&pzStack_20->next,seq_cst);
          if (pzStack_20 != (zombie_list_node *)0x0) {
            std::
            allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::zombie_list_node>>
            ::
            destroy<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::zombie_list_node>
                      ((allocator_type *)(this->m_list + 0x41),pzStack_20);
            std::
            allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::zombie_list_node>_>
            ::deallocate((allocator_type *)(this->m_list + 0x41),pzStack_20,1);
          }
        }
        std::
        atomic<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::zombie_list_node_*>
        ::store(&this->m_zombie->next,(__pointer_type)0x0,seq_cst);
      }
      std::
      atomic<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::rcu_guard_*>
      ::store(&this->m_zombie->owner,(__pointer_type)0x0,seq_cst);
      return;
    }
    prVar3 = std::
             atomic<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::rcu_guard_*>
             ::load(&pzStack_20->owner,seq_cst);
    if (prVar3 != (__pointer_type)0x0) {
      bVar1 = false;
      goto LAB_0011dd2a;
    }
    pzStack_20 = std::
                 atomic<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::zombie_list_node_*>
                 ::load(&pzStack_20->next,seq_cst);
  } while( true );
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::unlock()
{
   zombie_list_node *cached_next = m_zombie->next.load();
   zombie_list_node *n           = cached_next;

   bool last = true;

   while (n) {
      if (n->owner.load() != nullptr) {
         last = false;
         break;
      }

      n = n->next.load();
   }

   n = cached_next;

   if (last) {
      while (n) {
         node *deadNode = n->zombie_node;

         if (deadNode != nullptr) {
            node_alloc_trait::destroy(m_list->m_node_alloc, deadNode);
            node_alloc_trait::deallocate(m_list->m_node_alloc, deadNode, 1);
         }

         zombie_list_node *oldnode = n;
         n = n->next.load();

         if (oldnode != nullptr) {
            zombie_alloc_trait::destroy(m_list->m_zombie_alloc, oldnode);
            zombie_alloc_trait::deallocate(m_list->m_zombie_alloc, oldnode, 1);
         }
      }

      m_zombie->next.store(n);
   }

   m_zombie->owner.store(nullptr);
}